

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_mips.cpp
# Opt level: O3

void __thiscall
AdvancedMipsGenerator::Transform2REG(AdvancedMipsGenerator *this,string *in,string *out)

{
  size_t __n;
  undefined1 *puVar1;
  bool bVar2;
  int iVar3;
  undefined1 *local_48;
  size_t local_40;
  undefined1 local_38 [16];
  
  bVar2 = REGJudge(this,in);
  if (bVar2) {
    std::__cxx11::string::_M_assign((string *)out);
    return;
  }
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"$v0","");
  puVar1 = local_48;
  __n = in->_M_string_length;
  if (__n == local_40) {
    if (__n == 0) {
      bVar2 = true;
    }
    else {
      iVar3 = bcmp((in->_M_dataplus)._M_p,local_48,__n);
      bVar2 = iVar3 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if (puVar1 != local_38) {
    operator_delete(puVar1);
  }
  if (bVar2) {
    std::__cxx11::string::_M_replace((ulong)out,0,(char *)out->_M_string_length,0x160b1a);
  }
  return;
}

Assistant:

void AdvancedMipsGenerator::Transform2REG(const string& in, string& out) {
    if (REGJudge(in)) {
        out = in;
    } else if (in == V0_REG) {
        out = "$v0";
    }
}